

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPrinters.cpp
# Opt level: O2

void anon_unknown.dwarf_2a8564::logClock(SessionWriter *writer,uint64_t clock)

{
  Session *this;
  __atomic_base<unsigned_long> _Var1;
  allocator local_f7;
  allocator local_f6;
  allocator local_f5;
  allocator local_f4;
  allocator local_f3;
  char local_f2 [2];
  uint64_t local_f0;
  undefined1 local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  uint64_t local_78;
  string local_70 [32];
  string local_50 [32];
  
  local_f0 = clock;
  if (logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
    this = writer->_session;
    local_e8._0_8_ = 0;
    local_e8._8_2_ = info;
    std::__cxx11::string::string((string *)(local_e8 + 0x10),"main",&local_f3);
    std::__cxx11::string::string(local_b8,"logClock",&local_f4);
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestPrinters.cpp"
               ,&local_f5);
    local_78 = 0x1c;
    std::__cxx11::string::string(local_70,"{}",&local_f6);
    local_f2[0] = 'L';
    local_f2[1] = '\0';
    std::__cxx11::string::string(local_50,local_f2,&local_f7);
    _Var1._M_i = binlog::Session::addEventSource(this,(EventSource *)local_e8);
    binlog::EventSource::~EventSource((EventSource *)local_e8);
    LOCK();
    UNLOCK();
    logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
  }
  binlog::SessionWriter::addEvent<unsigned_long&>
            (writer,(uint64_t)logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i,clock,
             &local_f0);
  return;
}

Assistant:

void logClock(binlog::SessionWriter& writer, std::uint64_t clock)
{
  BINLOG_CREATE_SOURCE_AND_EVENT(writer, binlog::Severity::info, main, clock, "{}", clock);
}